

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cc
# Opt level: O0

void __thiscall
Volume::calculateVisualSpace
          (Volume *this,
          vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          *_obstcs,Vector2d *obs,Mat *src)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pOVar5;
  reference pEVar6;
  value_type *in_RCX;
  undefined8 in_RSI;
  long in_RDI;
  RealScalar RVar7;
  Vector2d diff;
  Edge *eg;
  iterator __end3;
  iterator __begin3;
  vector<Edge,_std::allocator<Edge>_> *__range3;
  Object *projectee;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Object,_std::allocator<Object>_> *__range2_1;
  Object *obj_1;
  size_t obj_id;
  size_t i;
  Object obj;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  *obstacle_1;
  iterator __end1_5;
  iterator __begin1_5;
  vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  *__range1_5;
  int obj_cnt;
  Point *pt_4;
  const_iterator __end1_4;
  const_iterator __begin1_4;
  array<cv::Point_<int>,_9UL> *__range1_4;
  Point *pt_3;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  array<cv::Point_<int>,_11UL> *__range1_3;
  Point *pt_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  array<cv::Point_<int>,_9UL> *__range1_2;
  Point *pt_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  array<cv::Point_<int>,_11UL> *__range1_1;
  Point *pt;
  const_iterator __end2;
  const_iterator __begin2;
  Obstacle *__range2;
  Obstacle *obstacle;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *__range1;
  vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  obstcs;
  Vector2d *in_stack_00000420;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  *in_stack_00000428;
  Object *in_stack_00000430;
  undefined4 in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  *in_stack_fffffffffffffcf0;
  value_type *in_stack_fffffffffffffcf8;
  vector<Object,_std::allocator<Object>_> *in_stack_fffffffffffffd00;
  unsigned_long *in_stack_fffffffffffffd08;
  Object *in_stack_fffffffffffffd10;
  reference other;
  reference this_00;
  Point_<int> local_2b8 [7];
  Vector2d *in_stack_fffffffffffffd80;
  Object *in_stack_fffffffffffffd88;
  Object *in_stack_fffffffffffffd90;
  Vector2d *in_stack_fffffffffffffd98;
  Object *in_stack_fffffffffffffda0;
  iterator in_stack_fffffffffffffe30;
  iterator in_stack_fffffffffffffe38;
  Volume *in_stack_fffffffffffffe40;
  __normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_> local_190;
  long local_188;
  reference local_180;
  size_type local_178;
  ulong local_170;
  reference local_130;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  *local_128;
  __normal_iterator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_*,_std::vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>_>
  local_120;
  undefined1 *local_118;
  int local_10c;
  const_iterator local_108;
  const_iterator local_100;
  const_iterator local_f8;
  array<cv::Point_<int>,_9UL> *local_f0;
  const_iterator local_e8;
  const_iterator local_e0;
  const_iterator local_d8;
  array<cv::Point_<int>,_11UL> *local_d0;
  const_iterator local_c8;
  const_iterator local_c0;
  const_iterator local_b8;
  array<cv::Point_<int>,_9UL> *local_b0;
  const_iterator local_a8;
  const_iterator local_a0;
  const_iterator local_98;
  array<cv::Point_<int>,_11UL> *local_90;
  reference local_88;
  Point_<int> *local_80;
  __normal_iterator<const_cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
  local_78;
  reference local_70;
  reference local_58;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *local_50;
  __normal_iterator<const_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
  local_48;
  undefined8 local_40;
  undefined1 local_38 [24];
  value_type *local_20;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::vector<Object,_std::allocator<Object>_>::clear
            ((vector<Object,_std::allocator<Object>_> *)0x15b5a2);
  std::
  vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  ::vector((vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
            *)0x15b5af);
  local_40 = local_10;
  local_48._M_current =
       (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
       std::
       vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
       ::begin((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  local_50 = (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
             std::
             vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ::end((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                             *)in_stack_fffffffffffffcf0,
                            (__normal_iterator<const_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8)), bVar2
        ) {
    local_58 = __gnu_cxx::
               __normal_iterator<const_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
               ::operator*(&local_48);
    std::
    vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
    ::emplace_back<>(in_stack_fffffffffffffcf0);
    local_70 = local_58;
    local_78._M_current =
         (Point_<int> *)
         std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::begin
                   ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                    CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    local_80 = (Point_<int> *)
               std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::end
                         ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                          CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                               *)in_stack_fffffffffffffcf0,
                              (__normal_iterator<const_cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8)),
          bVar2) {
      local_88 = __gnu_cxx::
                 __normal_iterator<const_cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                 ::operator*(&local_78);
      std::
      vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
      ::back(in_stack_fffffffffffffcf0);
      std::vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>::
      emplace_back<int_const&,int_const&>
                ((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                  *)in_stack_fffffffffffffd00,&in_stack_fffffffffffffcf8->id,
                 (int *)in_stack_fffffffffffffcf0);
      __gnu_cxx::
      __normal_iterator<const_cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
      ::operator++(&local_78);
    }
    __gnu_cxx::
    __normal_iterator<const_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
    ::operator++(&local_48);
  }
  std::
  vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  ::emplace_back<>(in_stack_fffffffffffffcf0);
  local_90 = &north_wall;
  local_98 = std::array<cv::Point_<int>,_11UL>::begin((array<cv::Point_<int>,_11UL> *)0x15b723);
  local_a0 = std::array<cv::Point_<int>,_11UL>::end((array<cv::Point_<int>,_11UL> *)0x15b737);
  for (; local_98 != local_a0; local_98 = local_98 + 1) {
    local_a8 = local_98;
    std::
    vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
    ::back(in_stack_fffffffffffffcf0);
    std::vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>::
    emplace_back<int_const&,int_const&>
              ((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)in_stack_fffffffffffffd00,&in_stack_fffffffffffffcf8->id,
               (int *)in_stack_fffffffffffffcf0);
  }
  std::
  vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  ::emplace_back<>(in_stack_fffffffffffffcf0);
  local_b0 = &east_wall;
  local_b8 = std::array<cv::Point_<int>,_9UL>::begin((array<cv::Point_<int>,_9UL> *)0x15b7c9);
  local_c0 = std::array<cv::Point_<int>,_9UL>::end((array<cv::Point_<int>,_9UL> *)0x15b7dd);
  for (; local_b8 != local_c0; local_b8 = local_b8 + 1) {
    local_c8 = local_b8;
    std::
    vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
    ::back(in_stack_fffffffffffffcf0);
    std::vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>::
    emplace_back<int_const&,int_const&>
              ((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)in_stack_fffffffffffffd00,&in_stack_fffffffffffffcf8->id,
               (int *)in_stack_fffffffffffffcf0);
  }
  std::
  vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  ::emplace_back<>(in_stack_fffffffffffffcf0);
  local_d0 = &south_wall;
  local_d8 = std::array<cv::Point_<int>,_11UL>::begin((array<cv::Point_<int>,_11UL> *)0x15b86f);
  local_e0 = std::array<cv::Point_<int>,_11UL>::end((array<cv::Point_<int>,_11UL> *)0x15b883);
  for (; local_d8 != local_e0; local_d8 = local_d8 + 1) {
    local_e8 = local_d8;
    std::
    vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
    ::back(in_stack_fffffffffffffcf0);
    std::vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>::
    emplace_back<int_const&,int_const&>
              ((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)in_stack_fffffffffffffd00,&in_stack_fffffffffffffcf8->id,
               (int *)in_stack_fffffffffffffcf0);
  }
  std::
  vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  ::emplace_back<>(in_stack_fffffffffffffcf0);
  local_f0 = &west_wall;
  local_f8 = std::array<cv::Point_<int>,_9UL>::begin((array<cv::Point_<int>,_9UL> *)0x15b915);
  local_100 = std::array<cv::Point_<int>,_9UL>::end((array<cv::Point_<int>,_9UL> *)0x15b929);
  for (; local_f8 != local_100; local_f8 = local_f8 + 1) {
    local_108 = local_f8;
    std::
    vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
    ::back(in_stack_fffffffffffffcf0);
    std::vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>::
    emplace_back<int_const&,int_const&>
              ((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)in_stack_fffffffffffffd00,&in_stack_fffffffffffffcf8->id,
               (int *)in_stack_fffffffffffffcf0);
  }
  local_10c = 0;
  local_118 = local_38;
  local_120._M_current =
       (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
        *)std::
          vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
          ::begin((vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  local_128 = (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
               *)std::
                 vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
                 ::end((vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_*,_std::vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>_>
                             *)in_stack_fffffffffffffcf0,
                            (__normal_iterator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_*,_std::vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8)), bVar2
        ) {
    local_130 = __gnu_cxx::
                __normal_iterator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_*,_std::vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>_>
                ::operator*(&local_120);
    Object::Object(in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
    Object::intialize(in_stack_00000430,in_stack_00000428,in_stack_00000420);
    std::vector<Object,_std::allocator<Object>_>::push_back
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    local_10c = local_10c + 1;
    Object::~Object((Object *)0x15ba71);
    __gnu_cxx::
    __normal_iterator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_*,_std::vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>_>
    ::operator++(&local_120);
  }
  for (local_170 = 0; uVar1 = local_170,
      sVar3 = std::vector<Object,_std::allocator<Object>_>::size
                        ((vector<Object,_std::allocator<Object>_> *)(in_RDI + 0x20)), uVar1 < sVar3;
      local_170 = local_170 + 1) {
    std::
    priority_queue<unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,Volume::ObjCompFunctor>
    ::emplace<unsigned_long&>
              ((priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Volume::ObjCompFunctor>
                *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  }
  while (bVar2 = std::
                 priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Volume::ObjCompFunctor>
                 ::empty((priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Volume::ObjCompFunctor>
                          *)0x15bb15), !bVar2) {
    pvVar4 = std::
             priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Volume::ObjCompFunctor>
             ::top((priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Volume::ObjCompFunctor>
                    *)0x15bb37);
    local_178 = *pvVar4;
    local_180 = std::vector<Object,_std::allocator<Object>_>::operator[]
                          ((vector<Object,_std::allocator<Object>_> *)(in_RDI + 0x20),local_178);
    std::
    priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Volume::ObjCompFunctor>
    ::pop((priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Volume::ObjCompFunctor>
           *)in_stack_fffffffffffffd00);
    Object::internalProjection(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    local_188 = in_RDI + 0x20;
    local_190._M_current =
         (Object *)
         std::vector<Object,_std::allocator<Object>_>::begin
                   ((vector<Object,_std::allocator<Object>_> *)
                    CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    std::vector<Object,_std::allocator<Object>_>::end
              ((vector<Object,_std::allocator<Object>_> *)
               CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>
                               *)in_stack_fffffffffffffcf0,
                              (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>
                               *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8)),
          bVar2) {
      pOVar5 = __gnu_cxx::__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>
               ::operator*(&local_190);
      if (((pOVar5->valid & 1U) != 0) && (local_180->id != pOVar5->id)) {
        other = local_180;
        this_00 = pOVar5;
        Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
                  ((Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffffcf0,
                   (Matrix<double,_2,_1,_0,_2,_1> *)
                   CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        Object::externalOcclusion
                  (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        in_stack_fffffffffffffe40 = (Volume *)&pOVar5->edges;
        in_stack_fffffffffffffe38 =
             std::vector<Edge,_std::allocator<Edge>_>::begin
                       ((vector<Edge,_std::allocator<Edge>_> *)
                        CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        in_stack_fffffffffffffe30 =
             std::vector<Edge,_std::allocator<Edge>_>::end
                       ((vector<Edge,_std::allocator<Edge>_> *)
                        CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>
                                   *)in_stack_fffffffffffffcf0,
                                  (__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8)),
              bVar2) {
          pEVar6 = __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::
                   operator*((__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_> *
                             )&stack0xfffffffffffffe38);
          if (((pEVar6->valid & 1U) != 0) &&
             (sVar3 = std::
                      deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ::size((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              *)0x15bd04), sVar3 < 3)) {
            std::
            deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::front((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)in_stack_fffffffffffffd00);
            Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::block<2,1>
                      ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffd00
                       ,(Index)in_stack_fffffffffffffcf8,(Index)in_stack_fffffffffffffcf0);
            std::
            deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::back((deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)in_stack_fffffffffffffd00);
            Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::block<2,1>
                      ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffd00
                       ,(Index)in_stack_fffffffffffffcf8,(Index)in_stack_fffffffffffffcf0);
            Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,2,1,false>>::operator-
                      ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>
                        *)this_00,
                       (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>
                        *)other);
            Eigen::Matrix<double,2,1,0,2,1>::
            Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,2,1,false>const,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,2,1,false>const>>
                      ((Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffffcf0,
                       (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1,_false>_>_>
                        *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
            RVar7 = Eigen::MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::norm
                              ((MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
                               CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
            if (RVar7 < 1.0) {
              pEVar6->valid = false;
            }
          }
          __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::
          operator++((__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_> *)
                     &stack0xfffffffffffffe38);
        }
      }
      __gnu_cxx::__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>::
      operator++(&local_190);
    }
    in_stack_fffffffffffffcf8 = local_20;
    in_stack_fffffffffffffd00 =
         (vector<Object,_std::allocator<Object>_> *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::x
                   ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)0x15bdff);
    in_stack_fffffffffffffcec = (int)*(double *)in_stack_fffffffffffffd00;
    in_stack_fffffffffffffcf0 =
         (vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
          *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::y
                      ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)0x15be1d);
    cv::Point_<int>::Point_
              (local_2b8,in_stack_fffffffffffffcec,
               (int)(double)(in_stack_fffffffffffffcf0->
                            super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
    simplePreVisualize(in_stack_fffffffffffffe40,(Mat *)in_stack_fffffffffffffe38._M_current,
                       (Point *)in_stack_fffffffffffffe30._M_current);
  }
  std::
  vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  ::~vector((vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
             *)in_stack_fffffffffffffd00);
  return;
}

Assistant:

void Volume::calculateVisualSpace(const std::vector<Obstacle>& _obstcs, Eigen::Vector2d obs, cv::Mat& src) {
    objs.clear();
    std::vector<std::vector<Eigen::Vector2d>> obstcs;
    for (const Obstacle& obstacle: _obstcs) {            // 构建objects
        obstcs.emplace_back();
        for (const cv::Point& pt: obstacle)
            obstcs.back().emplace_back(pt.x, pt.y);
    }
    // ================ add walls ================
    obstcs.emplace_back();
    for (const cv::Point& pt: north_wall)
        obstcs.back().emplace_back(pt.x, pt.y); 
    obstcs.emplace_back();
    for (const cv::Point& pt: east_wall)
        obstcs.back().emplace_back(pt.x, pt.y); 
    obstcs.emplace_back();
    for (const cv::Point& pt: south_wall)
        obstcs.back().emplace_back(pt.x, pt.y); 
    obstcs.emplace_back();
    for (const cv::Point& pt: west_wall)
        obstcs.back().emplace_back(pt.x, pt.y); 

    int obj_cnt = 0;
    for (const std::vector<Eigen::Vector2d>& obstacle: obstcs) {            // 构建objects
        Object obj(obj_cnt);
        obj.intialize(obstacle, obs);
        objs.push_back(obj);
        obj_cnt++;
    }
    for (size_t i = 0; i < objs.size(); i++)            // 构建堆
        heap.emplace(i);
    while (heap.empty() == false) {
        size_t obj_id = heap.top();
        Object& obj = objs[obj_id];
        heap.pop();
        LOG_ERROR("Object %d, started to internal project.", obj_id);
        obj.internalProjection(obs);
        LOG_MARK("After interal proj, valids in object %d are:", obj_id);
        LOG_MARK("Object %d, started to external project.", obj_id);
        for (Object& projectee: objs) {
            // 不查看完全被遮挡的，不投影已经投影过的
            if (projectee.valid == false || obj.id == projectee.id) continue;
            LOG_GAY("External occ, object %lu", projectee.id);
            obj.externalOcclusion(projectee, obs);
            LOG_CHECK("Projectee (%d) processed, edges (valid):", projectee.id);
            for (Edge& eg: projectee.edges) {
                if (eg.valid == false || eg.size() > 2) continue;
                Eigen::Vector2d diff = eg.front().block<2, 1>(0, 0) - eg.back().block<2, 1>(0, 0);
                if (diff.norm() < 1.0) {
                    LOG_ERROR("Projectee %d has one singular edge, (%.4lf, %.4lf), (%.4lf, %.4lf)", projectee.id, eg.front().x(), eg.front().y(), eg.back().x(), eg.back().y());
                    eg.valid = false;
                }
            }
        }
        LOG_SHELL("After external proj, valids in object %d are:", obj_id);
        simplePreVisualize(src, cv::Point(obs.x(), obs.y()));
    }
}